

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
     ::main(void)

{
  complex<long_double> *pcVar1;
  long *plVar2;
  TPZFMatrix<std::complex<long_double>_> *this;
  complex<long_double> *pcVar3;
  complex<long_double> *pcVar4;
  complex<long_double> *pcVar5;
  TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
  *this_00;
  TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
  *this_01;
  longdouble lVar6;
  TPZVec<int> NumConnected;
  TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
  TestFront;
  TPZVec<long> DestInd3;
  TPZFMatrix<std::complex<long_double>_> KEl3;
  TPZVec<long> DestInd2;
  int j;
  int i;
  TPZFMatrix<std::complex<long_double>_> KEl2;
  TPZVec<long> DestInd1;
  TPZFMatrix<std::complex<long_double>_> KEl1;
  TPZVec<long> *in_stack_00008b00;
  TPZFMatrix<std::complex<long_double>_> *in_stack_00008b08;
  TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
  *in_stack_00008b10;
  int64_t iVar7;
  undefined2 uVar8;
  undefined6 in_stack_fffffffffffffa72;
  TPZVec<long> *in_stack_fffffffffffffa78;
  int64_t in_stack_fffffffffffffa80;
  int64_t in_stack_fffffffffffffa88;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffa90;
  int64_t in_stack_fffffffffffffaf0;
  int64_t in_stack_fffffffffffffaf8;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffb00;
  TPZVec<int> local_498 [19];
  TPZVec<long> local_228 [5];
  TPZVec<long> local_178;
  int local_158;
  int local_154;
  TPZVec<long> local_c0 [6];
  
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  pcVar1 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar1,(longdouble)4.0);
  pcVar1 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar1,(longdouble)6.0);
  pcVar1 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar1,(longdouble)6.0);
  pcVar1 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  lVar6 = (longdouble)12.0;
  iVar7 = SUB108(lVar6,0);
  uVar8 = (undefined2)((unkuint10)lVar6 >> 0x40);
  std::complex<long_double>::operator=(pcVar1,lVar6);
  TPZVec<long>::TPZVec((TPZVec<long> *)CONCAT62(in_stack_fffffffffffffa72,uVar8),iVar7);
  plVar2 = TPZVec<long>::operator[](local_c0,0);
  *plVar2 = 0;
  plVar2 = TPZVec<long>::operator[](local_c0,1);
  *plVar2 = 1;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  pcVar1 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar1,(longdouble)4.0);
  pcVar1 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar1,(longdouble)-6.0);
  pcVar1 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar1,(longdouble)2.0);
  pcVar1 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar1,(longdouble)6.0);
  pcVar1 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar1,(longdouble)12.0);
  this = (TPZFMatrix<std::complex<long_double>_> *)
         TPZFMatrix<std::complex<long_double>_>::operator()
                   (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  std::complex<long_double>::operator=((complex<long_double> *)this,(longdouble)-6.0);
  pcVar1 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar1,(longdouble)-12.0);
  pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar3,(longdouble)4.0);
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar4,(longdouble)6.0);
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  lVar6 = (longdouble)12.0;
  iVar7 = SUB108(lVar6,0);
  uVar8 = (undefined2)((unkuint10)lVar6 >> 0x40);
  std::complex<long_double>::operator=(pcVar4,lVar6);
  for (local_154 = 0; local_154 < 4; local_154 = local_154 + 1) {
    for (local_158 = local_154; local_158 < 4; local_158 = local_158 + 1) {
      pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()
                         (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                          in_stack_fffffffffffffa80);
      pcVar5 = TPZFMatrix<std::complex<long_double>_>::operator()
                         (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                          in_stack_fffffffffffffa80);
      *(undefined8 *)pcVar5->_M_value = *(undefined8 *)pcVar4->_M_value;
      *(undefined8 *)(pcVar5->_M_value + 8) = *(undefined8 *)(pcVar4->_M_value + 8);
      *(undefined8 *)(pcVar5->_M_value + 0x10) = *(undefined8 *)(pcVar4->_M_value + 0x10);
      *(undefined8 *)(pcVar5->_M_value + 0x18) = *(undefined8 *)(pcVar4->_M_value + 0x18);
    }
  }
  TPZVec<long>::TPZVec((TPZVec<long> *)CONCAT62(in_stack_fffffffffffffa72,uVar8),iVar7);
  plVar2 = TPZVec<long>::operator[](&local_178,0);
  *plVar2 = 0;
  plVar2 = TPZVec<long>::operator[](&local_178,1);
  *plVar2 = 1;
  plVar2 = TPZVec<long>::operator[](&local_178,2);
  *plVar2 = 2;
  this_00 = (TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
             *)TPZVec<long>::operator[](&local_178,3);
  (this_00->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)0x3;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(this,(int64_t)pcVar1,(int64_t)pcVar3);
  pcVar1 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar1,(longdouble)3.0);
  pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar3,(longdouble)3.0);
  pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  std::complex<long_double>::operator=(pcVar3,(longdouble)3.0);
  pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  lVar6 = (longdouble)6.0;
  iVar7 = SUB108(lVar6,0);
  uVar8 = (undefined2)((unkuint10)lVar6 >> 0x40);
  std::complex<long_double>::operator=(pcVar3,lVar6);
  TPZVec<long>::TPZVec((TPZVec<long> *)CONCAT62(in_stack_fffffffffffffa72,uVar8),iVar7);
  plVar2 = TPZVec<long>::operator[](local_228,0);
  *plVar2 = 2;
  this_01 = (TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
             *)TPZVec<long>::operator[](local_228,1);
  (this_01->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)0x3;
  TPZFrontMatrix(this_00,(int64_t)pcVar1);
  TPZVec<int>::TPZVec((TPZVec<int> *)CONCAT62(in_stack_fffffffffffffa72,uVar8),iVar7);
  for (local_154 = 0; local_154 < 4; local_154 = local_154 + 1) {
    in_stack_fffffffffffffa78 = (TPZVec<long> *)TPZVec<int>::operator[](local_498,(long)local_154);
    *(int *)&in_stack_fffffffffffffa78->_vptr_TPZVec = 2;
  }
  SetNumElConnected(this_01,(TPZVec<int> *)in_stack_fffffffffffffa78);
  SymbolicAddKel(this_01,in_stack_fffffffffffffa78);
  SymbolicAddKel(this_01,in_stack_fffffffffffffa78);
  SymbolicAddKel(this_01,in_stack_fffffffffffffa78);
  AllocData((TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
             *)CONCAT62(in_stack_fffffffffffffa72,uVar8));
  SetNumElConnected(this_01,(TPZVec<int> *)in_stack_fffffffffffffa78);
  AddKel(in_stack_00008b10,in_stack_00008b08,in_stack_00008b00);
  AddKel(in_stack_00008b10,in_stack_00008b08,in_stack_00008b00);
  AddKel(in_stack_00008b10,in_stack_00008b08,in_stack_00008b00);
  TPZVec<int>::~TPZVec((TPZVec<int> *)CONCAT62(in_stack_fffffffffffffa72,uVar8));
  ~TPZFrontMatrix((TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
                   *)0x1d00fa9);
  TPZVec<long>::~TPZVec((TPZVec<long> *)CONCAT62(in_stack_fffffffffffffa72,uVar8));
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix
            ((TPZFMatrix<std::complex<long_double>_> *)0x1d00fc3);
  TPZVec<long>::~TPZVec((TPZVec<long> *)CONCAT62(in_stack_fffffffffffffa72,uVar8));
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix
            ((TPZFMatrix<std::complex<long_double>_> *)0x1d00fdd);
  TPZVec<long>::~TPZVec((TPZVec<long> *)CONCAT62(in_stack_fffffffffffffa72,uVar8));
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix
            ((TPZFMatrix<std::complex<long_double>_> *)0x1d00ff7);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::main()
{
	TPZFMatrix<TVar> KEl1(2,2);
	KEl1(0,0)=4.;
	KEl1(0,1)=6.;
	KEl1(1,0)=6.;
	KEl1(1,1)=12.;
	TPZVec<int64_t> DestInd1(2);
	DestInd1[0]=0;
	DestInd1[1]=1;
	
	
	TPZFMatrix<TVar> KEl2(4,4);
	KEl2(0,0)=4.;
	KEl2(0,1)=-6.;
	KEl2(0,2)=2.;
	KEl2(0,3)=6.;
	
	KEl2(1,1)=12;
	KEl2(1,2)=-6.;
	KEl2(1,3)=-12.;
	
	KEl2(2,2)=4.;
	KEl2(2,3)=6.;
	
	KEl2(3,3)=12.;
	
	int i, j;
	for(i=0;i<4;i++) {
		for(j=i;j<4;j++) KEl2(j,i)=KEl2(i,j);
	}
	
	TPZVec<int64_t> DestInd2(4);
	DestInd2[0]=0;
	DestInd2[1]=1;
	DestInd2[2]=2;
	DestInd2[3]=3;

	TPZFMatrix<TVar> KEl3(2,2);
	KEl3(0,0)=3.;
	KEl3(0,1)=3.;
	KEl1(1,0)=3.;
	KEl3(1,1)=6.;
	
	TPZVec<int64_t> DestInd3(2);
	DestInd3[0]=2;
	DestInd3[1]=3;

	TPZFrontMatrix TestFront(4);
	
	TPZVec<int> NumConnected(4);
	for(i=0;i<4;i++) NumConnected[i]=2;
	
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.SymbolicAddKel(DestInd1);
	TestFront.SymbolicAddKel(DestInd2);
	TestFront.SymbolicAddKel(DestInd3);
	
	TestFront.AllocData();
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.AddKel(KEl1,DestInd1);
	TestFront.AddKel(KEl2,DestInd2);
	TestFront.AddKel(KEl3,DestInd3);
}